

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerFlushOnCommit(Pager *pPager,int bCommit)

{
  int iVar1;
  int bCommit_local;
  Pager *pPager_local;
  
  if (pPager->tempFile == '\0') {
    pPager_local._4_4_ = 1;
  }
  else if (bCommit == 0) {
    pPager_local._4_4_ = 0;
  }
  else if (pPager->fd->pMethods == (sqlite3_io_methods *)0x0) {
    pPager_local._4_4_ = 0;
  }
  else {
    iVar1 = sqlite3PCachePercentDirty(pPager->pPCache);
    pPager_local._4_4_ = (uint)(0x18 < iVar1);
  }
  return pPager_local._4_4_;
}

Assistant:

static int pagerFlushOnCommit(Pager *pPager, int bCommit){
  if( pPager->tempFile==0 ) return 1;
  if( !bCommit ) return 0;
  if( !isOpen(pPager->fd) ) return 0;
  return (sqlite3PCachePercentDirty(pPager->pPCache)>=25);
}